

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  u16 uVar1;
  byte bVar2;
  int iVar3;
  MemPage *pMVar4;
  char cVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  if (pCur->eState == '\x01') {
    pMVar4 = pCur->apPage[pCur->iPage];
    uVar1 = pCur->ix;
    uVar7 = uVar1 + 1;
    pCur->ix = uVar7;
    if (pMVar4->nCell <= uVar7) {
      pCur->ix = uVar1;
      iVar3 = btreeNext(pCur);
      return iVar3;
    }
    if (pMVar4->leaf != '\0') {
      return 0;
    }
    do {
      pMVar4 = pCur->apPage[pCur->iPage];
      if (pMVar4->leaf != '\0') {
        return 0;
      }
      uVar8 = *(uint *)(pMVar4->aData +
                       (CONCAT11(pMVar4->aCellIdx[(ulong)pCur->ix * 2],
                                 pMVar4->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar4->maskPage));
      iVar3 = moveToChild(pCur,uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18);
    } while (iVar3 == 0);
    return iVar3;
  }
  bVar2 = pCur->eState;
  if (bVar2 != 1) {
    if (2 < bVar2) {
      iVar3 = btreeRestoreCursorPosition(pCur);
      if (iVar3 != 0) {
        return iVar3;
      }
      bVar2 = pCur->eState;
    }
    if (bVar2 == 0) {
      return 0x65;
    }
    iVar3 = pCur->skipNext;
    if (iVar3 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar3) {
        return 0;
      }
    }
  }
  lVar6 = (long)pCur->iPage;
  pMVar4 = pCur->apPage[lVar6];
  uVar8 = pCur->ix + 1;
  uVar9 = (ulong)uVar8;
  uVar7 = (ushort)uVar8;
  pCur->ix = uVar7;
  if (uVar7 < pMVar4->nCell) {
    if (pMVar4->leaf == '\0') {
LAB_001401cd:
      iVar3 = moveToLeftmost(pCur);
      return iVar3;
    }
  }
  else {
    if (pMVar4->leaf == '\0') {
      uVar8 = *(uint *)(pMVar4->aData + (ulong)pMVar4->hdrOffset + 8);
      iVar3 = moveToChild(pCur,uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18);
      if (iVar3 != 0) {
        return iVar3;
      }
      goto LAB_001401cd;
    }
    do {
      cVar5 = (char)lVar6;
      if (cVar5 == '\0') {
        pCur->eState = '\0';
        return 0x65;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->ix = pCur->aiIdx[(long)cVar5 + -1];
      pCur->iPage = cVar5 + -1;
      sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
      lVar6 = (long)pCur->iPage;
      pMVar4 = pCur->apPage[lVar6];
    } while (pMVar4->nCell <= pCur->ix);
    if (pMVar4->intKey != '\0') {
      iVar3 = sqlite3BtreeNext(pCur,(int)uVar9);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}